

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

void __thiscall IDisk::CleanDisk(IDisk *this)

{
  int side;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 < this->nb_sides_; uVar1 = uVar1 + 1) {
    (*this->_vptr_IDisk[8])(this,(ulong)uVar1);
  }
  this->disk_modified_ = false;
  this->side_[0].nb_tracks = 0;
  this->side_[0].tracks = (MFMTrack *)0x0;
  this->side_[1].nb_tracks = 0;
  this->side_[1].tracks = (MFMTrack *)0x0;
  this->nb_sides_ = '\0';
  return;
}

Assistant:

void IDisk::CleanDisk()
{
   //
   for (int side = 0; side < nb_sides_; side ++)
   {
      CleanSide(side);
   }
   disk_modified_ = false;

   side_[0].nb_tracks = 0;
   side_[0].tracks = nullptr;
   side_[1].nb_tracks = 0;
   side_[1].tracks = nullptr;
   nb_sides_ = 0;
}